

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixAllDescriptorOptions(Generator *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FileOptions *this_00;
  EnumDescriptor *enum_descriptor_00;
  FieldDescriptor *field_00;
  Descriptor *descriptor;
  int local_cc;
  int i_2;
  FieldDescriptor *field;
  int i_1;
  EnumDescriptor *enum_descriptor;
  int i;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string file_options;
  Generator *this_local;
  
  file_options.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FileOptions",&local_51);
  this_00 = FileDescriptor::options(this->file_);
  MessageLite::SerializeAsString_abi_cxx11_(&local_88,(MessageLite *)this_00);
  OptionsValue((string *)local_30,this,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"None");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"DESCRIPTOR",(allocator<char> *)((long)&enum_descriptor + 7));
    anon_unknown_0::PrintDescriptorOptionsFixingCode((string *)&i,(string *)local_30,this->printer_)
    ;
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)((long)&enum_descriptor + 7));
  }
  for (enum_descriptor._0_4_ = 0; iVar3 = (int)enum_descriptor,
      iVar2 = FileDescriptor::enum_type_count(this->file_), iVar3 < iVar2;
      enum_descriptor._0_4_ = (int)enum_descriptor + 1) {
    enum_descriptor_00 = FileDescriptor::enum_type(this->file_,(int)enum_descriptor);
    FixOptionsForEnum(this,enum_descriptor_00);
  }
  for (field._4_4_ = 0; iVar3 = FileDescriptor::extension_count(this->file_), field._4_4_ < iVar3;
      field._4_4_ = field._4_4_ + 1) {
    field_00 = FileDescriptor::extension(this->file_,field._4_4_);
    FixOptionsForField(this,field_00);
  }
  for (local_cc = 0; iVar3 = FileDescriptor::message_type_count(this->file_), local_cc < iVar3;
      local_cc = local_cc + 1) {
    descriptor = FileDescriptor::message_type(this->file_,local_cc);
    FixOptionsForMessage(this,descriptor);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Generator::FixAllDescriptorOptions() const {
  // Prints an expression that sets the file descriptor's options.
  string file_options = OptionsValue(
      "FileOptions", file_->options().SerializeAsString());
  if (file_options != "None") {
    PrintDescriptorOptionsFixingCode(kDescriptorKey, file_options, printer_);
  }
  // Prints expressions that set the options for all top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    FixOptionsForEnum(enum_descriptor);
  }
  // Prints expressions that set the options for all top level extensions.
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& field = *file_->extension(i);
    FixOptionsForField(field);
  }
  // Prints expressions that set the options for all messages, nested enums,
  // nested extensions and message fields.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixOptionsForMessage(*file_->message_type(i));
  }
}